

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O0

void __thiscall Environment::Define(Environment *this,size_t symbol)

{
  mapped_type *this_00;
  undefined1 local_39;
  tuple<bool,_unsigned_long> local_38;
  size_type local_28;
  size_t idx;
  unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>
  *env;
  size_t symbol_local;
  Environment *this_local;
  
  env = (unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>
         *)symbol;
  symbol_local = (size_t)this;
  idx = (size_t)std::
                vector<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
                ::back(&this->slot_map);
  local_28 = std::
             unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>
             ::size((unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>
                     *)idx);
  local_39 = 0;
  std::make_tuple<bool,unsigned_long&>((bool *)&local_38,(unsigned_long *)&local_39);
  this_00 = std::
            unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>
            ::operator[]((unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>
                          *)idx,(key_type *)&env);
  std::tuple<bool,_unsigned_long>::operator=(this_00,&local_38);
  return;
}

Assistant:

void Environment::Define(size_t symbol) {
  std::unordered_map<size_t, std::tuple<bool, size_t>> &env = slot_map.back();
  size_t idx = env.size();
  env[symbol] = std::make_tuple(false, idx);
}